

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

FunctionProxy * __thiscall Js::ScriptFunction::GetFunctionProxy(ScriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  FunctionInfo *pFVar4;
  undefined4 *puVar5;
  FunctionProxy *pFVar6;
  ScriptFunction *this_local;
  
  pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->
                     (&(this->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo);
  BVar3 = FunctionInfo::HasBody(pFVar4);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x115,"(this->functionInfo->HasBody())",
                                "this->functionInfo->HasBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->
                     (&(this->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo);
  pFVar6 = FunctionInfo::GetFunctionProxy(pFVar4);
  return pFVar6;
}

Assistant:

FunctionProxy * ScriptFunction::GetFunctionProxy() const
    {
        Assert(this->functionInfo->HasBody());
        return this->functionInfo->GetFunctionProxy();
    }